

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O3

Expression *
slang::ast::ValueRangeExpression::fromSyntax
          (Compilation *comp,ValueRangeExpressionSyntax *syntax,ASTContext *context)

{
  TokenKind TVar1;
  bool bVar2;
  logic_t lVar3;
  Expression *pEVar4;
  Expression *args_3;
  ValueRangeExpression *expr;
  Type *pTVar5;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *rhs;
  SourceLocation location;
  Diagnostic *pDVar6;
  bitmask<slang::ast::ASTFlags> extraFlags;
  char cVar7;
  ValueRangeKind rangeKind;
  ConstantValue cvl;
  ConstantValue cvr;
  Type *local_98;
  Type *local_90;
  ValueRangeKind local_84;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_80;
  char local_60;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  TVar1 = (syntax->op).kind;
  if (TVar1 == PlusModMinus) {
    local_84 = RelativeTolerance;
  }
  else {
    if (TVar1 != PlusDivMinus) {
      local_84 = Simple;
      extraFlags.m_bits = 0x200;
      goto LAB_0042f0be;
    }
    local_84 = AbsoluteTolerance;
  }
  extraFlags.m_bits = 0;
LAB_0042f0be:
  pEVar4 = Expression::create(comp,(syntax->left).ptr,context,extraFlags,(Type *)0x0);
  args_3 = Expression::create(comp,(syntax->right).ptr,context,extraFlags,(Type *)0x0);
  pTVar5 = comp->voidType;
  local_80._M_rest._0_16_ =
       (undefined1  [16])slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  expr = BumpAllocator::
         emplace<slang::ast::ValueRangeExpression,slang::ast::Type_const&,slang::ast::ValueRangeKind&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
                   (&comp->super_BumpAllocator,pTVar5,&local_84,pEVar4,args_3,
                    (SourceRange *)&local_80);
  bVar2 = Expression::bad(pEVar4);
  if ((!bVar2) && (bVar2 = Expression::bad(args_3), !bVar2)) {
    local_98 = (pEVar4->type).ptr;
    local_90 = (args_3->type).ptr;
    if (local_84 == Simple) {
      pTVar5 = local_98->canonical;
      if (pTVar5 == (Type *)0x0) {
        Type::resolveCanonical(local_98);
        pTVar5 = local_98->canonical;
      }
      if ((pTVar5->super_Symbol).kind == UnboundedType) {
        local_98 = comp->intType;
        pTVar5 = local_90->canonical;
        if (pTVar5 == (Type *)0x0) {
          Type::resolveCanonical(local_90);
          pTVar5 = local_90->canonical;
        }
        if ((pTVar5->super_Symbol).kind == UnboundedType) {
          ASTContext::addDiag(context,(DiagCode)0xa90007,(expr->super_Expression).sourceRange);
        }
      }
      pTVar5 = local_90->canonical;
      if (pTVar5 == (Type *)0x0) {
        Type::resolveCanonical(local_90);
        pTVar5 = local_90->canonical;
      }
      if ((pTVar5->super_Symbol).kind == UnboundedType) {
        local_90 = comp->intType;
      }
      bVar2 = Type::isNumeric(local_98);
      if (((bVar2) && (bVar2 = Type::isNumeric(local_90), bVar2)) ||
         ((bVar2 = Expression::isImplicitString(pEVar4), bVar2 &&
          (bVar2 = Expression::isImplicitString(args_3), bVar2)))) {
        ASTContext::tryEval((ConstantValue *)&local_80,context,pEVar4);
        ASTContext::tryEval((ConstantValue *)&local_58,context,args_3);
        if ((local_60 == '\x01') && (local_58._M_index == '\x01')) {
          this = std::
                 get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                           ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_80);
          rhs = std::
                get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                          ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            *)&local_58);
          lVar3 = SVInt::operator<=(this,rhs);
          cVar7 = lVar3.value == '\0';
          if (lVar3.value == '@') {
            cVar7 = -0x80;
          }
          if (lVar3.value == 0x80) {
            cVar7 = -0x80;
          }
          if (((cVar7 != '\0') && (cVar7 != -0x80)) && (cVar7 != '@')) {
            ASTContext::addDiag(context,(DiagCode)0xd20007,(expr->super_Expression).sourceRange);
          }
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage(&local_58);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_80);
        return &expr->super_Expression;
      }
    }
    else {
      bVar2 = Type::isNumeric(local_98);
      if ((bVar2) && (bVar2 = Type::isNumeric(local_90), bVar2)) {
        Expression::selfDetermined(context,&expr->right_);
        return &expr->super_Expression;
      }
    }
    location = parsing::Token::location(&syntax->op);
    pDVar6 = ASTContext::addDiag(context,(DiagCode)0x330007,location);
    pDVar6 = Diagnostic::operator<<(pDVar6,pEVar4->sourceRange);
    pDVar6 = Diagnostic::operator<<(pDVar6,args_3->sourceRange);
    pDVar6 = ast::operator<<(pDVar6,local_98);
    ast::operator<<(pDVar6,local_90);
  }
  pEVar4 = Expression::badExpr(comp,&expr->super_Expression);
  return pEVar4;
}

Assistant:

Expression& ValueRangeExpression::fromSyntax(Compilation& comp,
                                             const ValueRangeExpressionSyntax& syntax,
                                             const ASTContext& context) {
    ValueRangeKind rangeKind;
    switch (syntax.op.kind) {
        case TokenKind::PlusDivMinus:
            rangeKind = ValueRangeKind::AbsoluteTolerance;
            break;
        case TokenKind::PlusModMinus:
            rangeKind = ValueRangeKind::RelativeTolerance;
            break;
        default:
            rangeKind = ValueRangeKind::Simple;
            break;
    }

    // Unbounded literals are allowed if we are not a tolerance range.
    const auto flags = rangeKind == ValueRangeKind::Simple ? ASTFlags::AllowUnboundedLiteral
                                                           : ASTFlags::None;
    auto& left = create(comp, *syntax.left, context, flags);
    auto& right = create(comp, *syntax.right, context, flags);
    auto result = comp.emplace<ValueRangeExpression>(comp.getVoidType(), rangeKind, left, right,
                                                     syntax.sourceRange());
    if (left.bad() || right.bad())
        return badExpr(comp, result);

    auto lt = left.type;
    auto rt = right.type;

    if (rangeKind == ValueRangeKind::Simple) {
        if (lt->isUnbounded()) {
            lt = &comp.getIntType();
            if (rt->isUnbounded())
                context.addDiag(diag::ValueRangeUnbounded, result->sourceRange);
        }

        if (rt->isUnbounded())
            rt = &comp.getIntType();

        if (!(lt->isNumeric() && rt->isNumeric()) &&
            !(left.isImplicitString() && right.isImplicitString())) {
            auto& diag = context.addDiag(diag::BadValueRange, syntax.op.location());
            diag << left.sourceRange << right.sourceRange << *lt << *rt;
            return badExpr(comp, result);
        }

        auto cvl = context.tryEval(left);
        auto cvr = context.tryEval(right);
        if (cvl.isInteger() && cvr.isInteger() && bool(cvl.integer() > cvr.integer()))
            context.addDiag(diag::ReversedValueRange, result->sourceRange);
    }
    else {
        if (!lt->isNumeric() || !rt->isNumeric()) {
            auto& diag = context.addDiag(diag::BadValueRange, syntax.op.location());
            diag << left.sourceRange << right.sourceRange << *lt << *rt;
            return badExpr(comp, result);
        }

        selfDetermined(context, result->right_);
    }

    return *result;
}